

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void SDL_MixAudio(Uint8 *dst,Uint8 *src,Uint32 len,int volume)

{
  SDL_AudioFormat SVar1;
  
  if (volume == 0) {
    return;
  }
  (*SDL20_LockAudio)();
  if (((byte)InitializedSubsystems20 & 0x10) != 0) {
    if ((audio_cbdata == (AudioCallbackWrapperData *)0x0) ||
       (audio_cbdata->app_callback_opened == SDL_FALSE)) {
      (*SDL20_UnlockAudio)();
    }
    else {
      SVar1 = (audio_cbdata->app_callback_format).format;
      (*SDL20_UnlockAudio)();
      if (SVar1 != 0) goto LAB_0011367f;
    }
    SDL_SetError("SDL_MixAudio(): unknown audio format");
    return;
  }
  (*SDL20_UnlockAudio)();
  SVar1 = 0x8010;
LAB_0011367f:
  (*SDL20_MixAudioFormat)(dst,src,SVar1,len,volume);
  return;
}

Assistant:

SDLCALL
SDL_MixAudio(Uint8 *dst, const Uint8 *src, Uint32 len, int volume)
{
    SDL_AudioFormat fmt;

    if (volume == 0) {
        return;  /* nothing to do. */
    }

    /* in 1.2, if not the subsystem isn't initialized _at all_, it forces
       format to AUDIO_S16. If it's initialized but the device isn't opened,
       you get a format of zero and it returns an error without mixing
       anything. */
    SDL20_LockAudio();
    if ((InitializedSubsystems20 & SDL_INIT_AUDIO) != SDL_INIT_AUDIO) {
        fmt = AUDIO_S16;  /* to quote 1.2: "HACK HACK HACK" */
    } else if (!audio_cbdata || !audio_cbdata->app_callback_opened) {
        fmt = 0;  /* this will fail, but drop the lock first. */
    } else {
        fmt = audio_cbdata->app_callback_format.format;
    }
    SDL20_UnlockAudio();

    if (fmt == 0) {
        SDL_SetError("SDL_MixAudio(): unknown audio format");  /* this is the exact error 1.2 reports for this. */
    } else {
        SDL20_MixAudioFormat(dst, src, fmt, len, volume);
    }
}